

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::BinaryFunctionException::BinaryFunctionException
          (BinaryFunctionException *this,string *functionname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_00116838;
  std::operator+(&local_50,"Error: binary function [",functionname);
  std::operator+(&local_30,&local_50,"] must have two operator numbers: ");
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_30
            );
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

BinaryFunctionException(const std::string& functionname) {
        error_msg = "Error: binary function [" + functionname +
                    "] must have two operator numbers: ";
    }